

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lest_cpp03.hpp
# Opt level: O0

lest * __thiscall
lest::to_string<char[1],std::__cxx11::string>
          (lest *this,char (*lhs) [1],string *op,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *rhs)

{
  ostream *poVar1;
  string local_218 [32];
  lest local_1f8 [48];
  char (*local_1c8) [1];
  lest local_1c0 [32];
  ostringstream local_1a0 [8];
  ostringstream os;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *rhs_local;
  string *op_local;
  char (*lhs_local) [1];
  
  std::__cxx11::ostringstream::ostringstream(local_1a0);
  local_1c8 = lhs;
  to_string_abi_cxx11_(local_1c0,(char **)&local_1c8);
  poVar1 = std::operator<<((ostream *)local_1a0,(string *)local_1c0);
  poVar1 = std::operator<<(poVar1," ");
  poVar1 = std::operator<<(poVar1,(string *)op);
  poVar1 = std::operator<<(poVar1," ");
  to_string(local_1f8,rhs);
  std::operator<<(poVar1,(string *)local_1f8);
  std::__cxx11::string::~string((string *)local_1f8);
  std::__cxx11::string::~string((string *)local_1c0);
  std::__cxx11::ostringstream::str();
  std::__cxx11::string::string((string *)this,local_218);
  std::__cxx11::string::~string(local_218);
  std::__cxx11::ostringstream::~ostringstream(local_1a0);
  return this;
}

Assistant:

std::string to_string( L const & lhs, std::string op, R const & rhs )
{
    std::ostringstream os; os << to_string( lhs ) << " " << op << " " << to_string( rhs ); return os.str();
}